

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uutils.c
# Opt level: O3

int lisp_string_to_c_string(LispPTR Lisp,char *C,size_t length)

{
  ushort uVar1;
  uint uVar2;
  DLword *pDVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  
  iVar7 = -1;
  if ((*(ushort *)((ulong)(Lisp >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 0xe) {
    if ((Lisp & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)Lisp);
    }
    pDVar3 = Lisp_world;
    uVar5 = (ulong)*(uint *)(Lisp_world + (ulong)Lisp + 4);
    if ((uVar5 < 0x14) && ((char)Lisp_world[(ulong)Lisp + 3] == 'C')) {
      iVar7 = 0;
      if (uVar5 == 0) {
        lVar4 = 0;
      }
      else {
        uVar2 = *(uint *)(Lisp_world + Lisp);
        uVar1 = Lisp_world[(ulong)Lisp + 2];
        uVar6 = 0;
        do {
          C[uVar6] = *(char *)((long)pDVar3 + uVar6 + (ulong)uVar1 + (ulong)(uVar2 & 0xfffffff) * 2
                              ^ 3);
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
        lVar4 = (long)*(int *)(pDVar3 + (ulong)Lisp + 4);
      }
      C[lVar4] = '\0';
    }
  }
  return iVar7;
}

Assistant:

static int lisp_string_to_c_string(LispPTR Lisp, char *C, size_t length) {
  OneDArray *arrayp;
  char *base;

  if (GetTypeNumber(Lisp) != TYPE_ONED_ARRAY) { return (-1); }

  arrayp = (OneDArray *)NativeAligned4FromLAddr(Lisp);
  if (arrayp->fillpointer >= length) { return (-1); } /* too long */

  switch (arrayp->typenumber) {
    case THIN_CHAR_TYPENUMBER:
      base = ((char *)NativeAligned2FromLAddr(arrayp->base)) + ((int)(arrayp->offset));
#ifndef BYTESWAP
      strncpy(C, base, arrayp->fillpointer);
#else
      {
        size_t l = arrayp->fillpointer;
        char *dp = C;
        for (size_t i = 0; i < l; i++) {
          *dp++ = (char)(GETBYTE(base++));
        }
      }
#endif /* BYTESWAP */

      C[arrayp->fillpointer] = '\0';
      return 0;
    default: return -1;
  }
}